

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

void mp_rshd(mp_int *a,int b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  mp_digit *__s;
  
  if (0 < b) {
    iVar1 = a->used;
    if (b < iVar1) {
      __s = a->dp;
      uVar4 = iVar1 - b;
      if (uVar4 == 0 || iVar1 < b) {
        uVar2 = 0;
      }
      else {
        uVar3 = uVar4;
        do {
          *__s = __s[(uint)b];
          __s = __s + 1;
          uVar3 = uVar3 - 1;
          uVar2 = uVar4;
        } while (uVar3 != 0);
      }
      if ((int)uVar2 < iVar1) {
        memset(__s,0,(ulong)(iVar1 + ~uVar2) * 8 + 8);
      }
      a->used = uVar4;
    }
    else {
      a->sign = 0;
      a->used = 0;
      if (0 < (long)a->alloc) {
        memset(a->dp,0,(long)a->alloc << 3);
        return;
      }
    }
  }
  return;
}

Assistant:

void mp_rshd (mp_int * a, int b)
{
  int     x;

  /* if b <= 0 then ignore it */
  if (b <= 0) {
    return;
  }

  /* if b > used then simply zero it and return */
  if (a->used <= b) {
    mp_zero (a);
    return;
  }

  {
    register mp_digit *bottom, *top;

    /* shift the digits down */

    /* bottom */
    bottom = a->dp;

    /* top [offset into digits] */
    top = a->dp + b;

    /* this is implemented as a sliding window where 
     * the window is b-digits long and digits from 
     * the top of the window are copied to the bottom
     *
     * e.g.

     b-2 | b-1 | b0 | b1 | b2 | ... | bb |   ---->
                 /\                   |      ---->
                  \-------------------/      ---->
     */
    for (x = 0; x < (a->used - b); x++) {
      *bottom++ = *top++;
    }

    /* zero the top digits */
    for (; x < a->used; x++) {
      *bottom++ = 0;
    }
  }
  
  /* remove excess digits */
  a->used -= b;
}